

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

MemoryInit * __thiscall
wasm::Builder::makeMemoryInit
          (Builder *this,Name segment,Expression *dest,Expression *offset,Expression *size,
          Name memory)

{
  MemoryInit *pMVar1;
  MemoryInit *ret;
  Expression *size_local;
  Expression *offset_local;
  Expression *dest_local;
  Builder *this_local;
  Name segment_local;
  
  segment_local.super_IString.str._M_len = segment.super_IString.str._M_str;
  this_local = segment.super_IString.str._M_len;
  pMVar1 = MixedArena::alloc<wasm::MemoryInit>((MixedArena *)(this->wasm + 0x158));
  Name::operator=(&pMVar1->segment,(Name *)&this_local);
  pMVar1->dest = dest;
  pMVar1->offset = offset;
  pMVar1->size = size;
  Name::operator=(&pMVar1->memory,&memory);
  wasm::MemoryInit::finalize();
  return pMVar1;
}

Assistant:

MemoryInit* makeMemoryInit(Name segment,
                             Expression* dest,
                             Expression* offset,
                             Expression* size,
                             Name memory) {
    auto* ret = wasm.allocator.alloc<MemoryInit>();
    ret->segment = segment;
    ret->dest = dest;
    ret->offset = offset;
    ret->size = size;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }